

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  bool bVar1;
  int iVar2;
  StringPiece x;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  StringPiece local_b0;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_90;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_70;
  string local_50;
  
  GetParts(&local_70,this,lhs);
  GetParts(&local_90,this,rhs);
  local_b0 = stringpiece_internal::StringPiece::substr(&local_70.first,0,local_90.first.length_);
  x = stringpiece_internal::StringPiece::substr(&local_90.first,0,local_70.first.length_);
  iVar2 = stringpiece_internal::StringPiece::compare(&local_b0,x);
  if (iVar2 == 0) {
    if (local_70.first.length_ == local_90.first.length_) {
      bVar1 = stringpiece_internal::operator<(local_70.second,local_90.second);
    }
    else {
      AsString_abi_cxx11_((string *)&local_b0,this,lhs);
      AsString_abi_cxx11_(&local_50,this,rhs);
      bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_b0,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  else {
    bVar1 = SUB41((uint)iVar2 >> 0x1f,0);
  }
  return bVar1;
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }